

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::initDaysMonthYearSectionIndex(DateTimePickerPrivate *this)

{
  qsizetype qVar1;
  const_reference pSVar2;
  int local_20;
  int local_1c;
  int i;
  int year;
  int month;
  int day;
  DateTimePickerPrivate *this_local;
  
  year = -1;
  i = -1;
  local_1c = -1;
  for (local_20 = 0;
      qVar1 = QList<QtMWidgets::Section>::size(&(this->super_DateTimeParser).sections),
      local_20 < qVar1; local_20 = local_20 + 1) {
    pSVar2 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_20);
    if ((pSVar2->type & DaySectionMask) == NoSection) {
      pSVar2 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_20)
      ;
      if ((pSVar2->type & MonthSectionMask) == NoSection) {
        pSVar2 = QList<QtMWidgets::Section>::at
                           (&(this->super_DateTimeParser).sections,(long)local_20);
        if ((pSVar2->type & YearSectionMask) != NoSection) {
          local_1c = local_20;
        }
      }
      else {
        i = local_20;
      }
    }
    else {
      year = local_20;
    }
  }
  this->daysSection = year;
  this->monthSection = i;
  this->yearSection = local_1c;
  return;
}

Assistant:

void
DateTimePickerPrivate::initDaysMonthYearSectionIndex()
{
	int day = -1;
	int month = -1;
	int year = -1;

	for( int i = 0; i < sections.size(); ++i )
	{
		if( sections.at( i ).type & Section::DaySectionMask )
			day = i;
		else if( sections.at( i ).type & Section::MonthSectionMask )
			month = i;
		else if( sections.at( i ).type & Section::YearSectionMask )
			year = i;
	}

	daysSection = day;
	monthSection = month;
	yearSection = year;
}